

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcMeasureWithUnit::~IfcMeasureWithUnit(IfcMeasureWithUnit *this)

{
  ~IfcMeasureWithUnit((IfcMeasureWithUnit *)
                      ((long)&(this->
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit,_2UL>).
                              _vptr_ObjectHelper +
                      (long)(this->
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit,_2UL>).
                            _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcMeasureWithUnit() : Object("IfcMeasureWithUnit") {}